

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::Decode(DeadReckoningParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KUINT16 i;
  long lVar2;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x27 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8DeadRecknoningAlgorithm);
    lVar2 = 0;
    do {
      KDataStream::Read(stream,this->m_OtherParams + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xf);
    (*(this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_LinearAcceleration,stream);
    (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AngularVelocity,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Decode","");
  KException::KException(this_00,&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void DeadReckoningParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < DEAD_RECKONING_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8DeadRecknoningAlgorithm;

    for( KUINT16 i = 0; i < 15; ++i )
    {
        stream >> m_OtherParams[i];
    }

    stream >> KDIS_STREAM m_LinearAcceleration
           >> KDIS_STREAM m_AngularVelocity;
}